

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorRasterizerTests.cpp
# Opt level: O3

void __thiscall
agge::tests::VectorRasterizerTests::
InterCellPositivelyInclinedTwoShortHLinesProducePositiveCoverAndArea(VectorRasterizerTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cell reference2 [2];
  cell reference1 [2];
  vector_rasterizer vr;
  string local_110;
  LocationInfo local_f0;
  undefined1 local_c8 [8];
  undefined1 auStack_c0 [24];
  undefined1 local_a8 [8];
  undefined1 auStack_a0 [16];
  vector_rasterizer local_90;
  
  vector_rasterizer::vector_rasterizer(&local_90);
  vector_rasterizer::line(&local_90,0x133,-0x1e6,0x14d,-0x40);
  local_a8._0_2_ = 1;
  local_a8._2_2_ = -2;
  local_a8._4_4_ = 0x6838;
  auStack_a0._0_2_ = 0xe6;
  auStack_a0._2_2_ = 1;
  auStack_a0._4_4_ = 0x6a80ffff;
  auStack_a0._8_4_ = 0xc00000;
  paVar1 = &local_110.field_2;
  local_110._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_f0,&local_110,0x332);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,2ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [2])local_a8,&local_90._cells,&local_f0);
  paVar2 = &local_f0.filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_f0.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar1) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  vector_rasterizer::reset(&local_90);
  vector_rasterizer::line(&local_90,0x33,0x1e6,0x80,0x245);
  local_c8._0_2_ = 0;
  local_c8._2_2_ = 1;
  local_c8._4_4_ = 0xc7e;
  auStack_c0._0_2_ = 0x1a;
  auStack_c0._2_2_ = 0;
  auStack_c0._4_4_ = 0x35e80002;
  auStack_c0._8_4_ = 0x450000;
  local_110._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_f0,&local_110,0x340);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,2ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [2])local_c8,&local_90._cells,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_f0.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar1) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (local_90._x_sorted_cells._begin != (cell *)0x0) {
    operator_delete__(local_90._x_sorted_cells._begin);
  }
  if (local_90._histogram_x._begin != (uint *)0x0) {
    operator_delete__(local_90._histogram_x._begin);
  }
  if (local_90._histogram_y._begin != (uint *)0x0) {
    operator_delete__(local_90._histogram_y._begin);
  }
  if (local_90._cells._begin != (cell *)0x0) {
    operator_delete__(local_90._cells._begin);
  }
  return;
}

Assistant:

test( InterCellPositivelyInclinedTwoShortHLinesProducePositiveCoverAndArea )
			{
				// INIT
				vector_rasterizer vr;

				// ACT (ctg = 252)
				vr.line(fp(1.2), fp(-1.9), fp(1.3), fp(-0.25)); // in fp - [(307, -486); (333, -64)), v(26, 422)

				// ASSERT
				const vector_rasterizer::cell reference1[] = {
					{ 1, -2, 26680, 230 }, // dx = 14
					{ 1, -1, 27264, 192 }, // dx = 12
				};

				assert_equal(reference1, vr.cells());

				// INIT
				vr.reset();

				// ACT (ctg = 3319)
				vr.line(fp(0.2), fp(1.9), fp(0.5), fp(2.27)); // in fp - [(51, 486); (128, 581)), v(77, 95)

				// ASSERT
				const vector_rasterizer::cell reference2[] = {
					{ 0, 1, 3198, 26 }, // dx = 21
					{ 0, 2, 13800, 69 }, // dx = 56
				};

				assert_equal(reference2, vr.cells());
			}